

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O3

void __thiscall
pzgeom::TPZArc3D::GradX<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  void *pvVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  int i;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  value_type vVar17;
  Fad<double> scale;
  Fad<double> Vtnorm;
  TPZManVector<Fad<double>,_10> OUTv;
  TPZManVector<Fad<double>,_10> Vpb;
  TPZManVector<Fad<double>,_10> Vpa;
  TPZManVector<Fad<double>,_10> Vpc;
  TPZManVector<Fad<double>,_10> middle;
  TPZManVector<Fad<double>,_10> Vt;
  undefined1 local_990 [16];
  double *local_980;
  double local_978;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_970;
  Fad<double> *local_960;
  Fad<double> *local_958;
  undefined1 local_950 [24];
  double *pdStack_938;
  undefined1 local_928 [16];
  double *local_918;
  double dStack_910;
  Fad<double> *local_908;
  FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>
  local_900;
  undefined1 local_8e8 [32];
  Fad<double> **local_8c8;
  Fad<double> *local_8c0;
  double dStack_8b8;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *local_8b0;
  Fad<double> *local_8a8;
  Fad<double> *local_8a0;
  undefined1 local_898 [16];
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> local_888;
  undefined1 local_878 [8];
  TPZManVector<Fad<double>,_10> local_870;
  TPZManVector<Fad<double>,_10> local_710;
  TPZManVector<Fad<double>,_10> local_5b0;
  TPZManVector<Fad<double>,_10> local_450;
  TPZManVector<Fad<double>,_10> local_2f0;
  TPZManVector<Fad<double>,_10> local_190;
  
  local_5b0.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_5b0.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_5b0.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_450,3,(Fad<double> *)&local_5b0);
  Fad<double>::~Fad((Fad<double> *)&local_5b0);
  local_710.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_710.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_710.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_710.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_5b0,3,(Fad<double> *)&local_710);
  Fad<double>::~Fad((Fad<double> *)&local_710);
  local_190.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_190.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_190.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_190.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_710,3,(Fad<double> *)&local_190);
  Fad<double>::~Fad((Fad<double> *)&local_190);
  local_870.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_870.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_870.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_870.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_190,3,(Fad<double> *)&local_870);
  Fad<double>::~Fad((Fad<double> *)&local_870);
  local_2f0.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_2f0.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_2f0.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_2f0.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_870,3,(Fad<double> *)&local_2f0);
  Fad<double>::~Fad((Fad<double> *)&local_2f0);
  local_950._0_8_ = (Fad<double> *)0x0;
  local_950._8_8_ = (ulong)(uint)local_950._12_4_ << 0x20;
  local_950._16_8_ = (double *)0x0;
  pdStack_938 = (double *)0x0;
  TPZManVector<Fad<double>,_10>::TPZManVector(&local_2f0,1,(Fad<double> *)local_950);
  Fad<double>::~Fad((Fad<double> *)local_950);
  X<Fad<double>>(this,coord,&local_2f0.super_TPZVec<Fad<double>_>,
                 &local_870.super_TPZVec<Fad<double>_>);
  if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar15 = *coord->fElem;
  pdVar10 = (double *)
            CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                     local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  pdVar9 = (double *)
           CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(pdVar10 + 1);
  uVar13 = (ulong)uVar1;
  uVar2 = *(uint *)(pdVar9 + 1);
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pvVar8 = (void *)pdVar9[2];
LAB_00f83a04:
      if (0 < (int)uVar1) {
        dVar16 = pdVar10[2];
        uVar11 = 0;
        do {
          *(ulong *)((long)pvVar8 + uVar11 * 8) =
               *(ulong *)((long)dVar16 + uVar11 * 8) ^ 0x8000000000000000;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      if ((void *)pdVar9[2] != (void *)0x0) {
        operator_delete__((void *)pdVar9[2]);
      }
      *(undefined4 *)(pdVar9 + 1) = 0;
      pdVar9[2] = 0.0;
    }
  }
  else {
    if (uVar2 != 0) {
      if ((void *)pdVar9[2] != (void *)0x0) {
        operator_delete__((void *)pdVar9[2]);
      }
      pdVar9[2] = 0.0;
    }
    *(uint *)(pdVar9 + 1) = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pvVar8 = operator_new__(uVar11);
    pdVar9[2] = (double)pvVar8;
    if (*(int *)(pdVar10 + 1) != 0) goto LAB_00f83a04;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        *(double *)((long)pvVar8 + uVar11 * 8) = -pdVar10[3];
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  *pdVar9 = dVar15 - *pdVar10;
  if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar15 = coord->fElem[1];
  lVar14 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  lVar12 = CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar14 + 0x28);
  uVar13 = (ulong)uVar1;
  uVar2 = *(uint *)(lVar12 + 0x28);
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pvVar8 = *(void **)(lVar12 + 0x30);
LAB_00f83b4d:
      if (0 < (int)uVar1) {
        lVar4 = *(long *)(lVar14 + 0x30);
        uVar11 = 0;
        do {
          *(ulong *)((long)pvVar8 + uVar11 * 8) =
               *(ulong *)(lVar4 + uVar11 * 8) ^ 0x8000000000000000;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x30) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x30));
      }
      *(undefined4 *)(lVar12 + 0x28) = 0;
      *(undefined8 *)(lVar12 + 0x30) = 0;
    }
  }
  else {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x30) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x30));
      }
      *(undefined8 *)(lVar12 + 0x30) = 0;
    }
    *(uint *)(lVar12 + 0x28) = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pvVar8 = operator_new__(uVar11);
    *(void **)(lVar12 + 0x30) = pvVar8;
    if (*(int *)(lVar14 + 0x28) != 0) goto LAB_00f83b4d;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        *(ulong *)((long)pvVar8 + uVar11 * 8) = *(ulong *)(lVar14 + 0x38) ^ 0x8000000000000000;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  *(double *)(lVar12 + 0x20) = dVar15 - *(double *)(lVar14 + 0x20);
  if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar15 = coord->fElem[2];
  lVar14 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  lVar12 = CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar14 + 0x48);
  uVar13 = (ulong)uVar1;
  uVar2 = *(uint *)(lVar12 + 0x48);
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pvVar8 = *(void **)(lVar12 + 0x50);
LAB_00f83c96:
      if (0 < (int)uVar1) {
        lVar4 = *(long *)(lVar14 + 0x50);
        uVar11 = 0;
        do {
          *(ulong *)((long)pvVar8 + uVar11 * 8) =
               *(ulong *)(lVar4 + uVar11 * 8) ^ 0x8000000000000000;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x50) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x50));
      }
      *(undefined4 *)(lVar12 + 0x48) = 0;
      *(undefined8 *)(lVar12 + 0x50) = 0;
    }
  }
  else {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x50) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x50));
      }
      *(undefined8 *)(lVar12 + 0x50) = 0;
    }
    *(uint *)(lVar12 + 0x48) = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pvVar8 = operator_new__(uVar11);
    *(void **)(lVar12 + 0x50) = pvVar8;
    if (*(int *)(lVar14 + 0x48) != 0) goto LAB_00f83c96;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        *(ulong *)((long)pvVar8 + uVar11 * 8) = *(ulong *)(lVar14 + 0x58) ^ 0x8000000000000000;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  *(double *)(lVar12 + 0x40) = dVar15 - *(double *)(lVar14 + 0x40);
  lVar14 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar14 < 1) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar15 = coord->fElem[lVar14];
  pdVar10 = (double *)
            CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                     local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  pdVar9 = (double *)
           CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(pdVar10 + 1);
  uVar13 = (ulong)uVar1;
  uVar2 = *(uint *)(pdVar9 + 1);
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pvVar8 = (void *)pdVar9[2];
LAB_00f83de6:
      if (0 < (int)uVar1) {
        dVar16 = pdVar10[2];
        uVar11 = 0;
        do {
          *(ulong *)((long)pvVar8 + uVar11 * 8) =
               *(ulong *)((long)dVar16 + uVar11 * 8) ^ 0x8000000000000000;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      if ((void *)pdVar9[2] != (void *)0x0) {
        operator_delete__((void *)pdVar9[2]);
      }
      *(undefined4 *)(pdVar9 + 1) = 0;
      pdVar9[2] = 0.0;
    }
  }
  else {
    if (uVar2 != 0) {
      if ((void *)pdVar9[2] != (void *)0x0) {
        operator_delete__((void *)pdVar9[2]);
      }
      pdVar9[2] = 0.0;
    }
    *(uint *)(pdVar9 + 1) = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pvVar8 = operator_new__(uVar11);
    pdVar9[2] = (double)pvVar8;
    if (*(int *)(pdVar10 + 1) != 0) goto LAB_00f83de6;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        *(double *)((long)pvVar8 + uVar11 * 8) = -pdVar10[3];
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  *pdVar9 = dVar15 - *pdVar10;
  lVar14 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar14 < 2) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar15 = coord->fElem[lVar14 + 1];
  lVar14 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  lVar12 = CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar14 + 0x28);
  uVar13 = (ulong)uVar1;
  uVar2 = *(uint *)(lVar12 + 0x28);
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pvVar8 = *(void **)(lVar12 + 0x30);
LAB_00f83f38:
      if (0 < (int)uVar1) {
        lVar4 = *(long *)(lVar14 + 0x30);
        uVar11 = 0;
        do {
          *(ulong *)((long)pvVar8 + uVar11 * 8) =
               *(ulong *)(lVar4 + uVar11 * 8) ^ 0x8000000000000000;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x30) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x30));
      }
      *(undefined4 *)(lVar12 + 0x28) = 0;
      *(undefined8 *)(lVar12 + 0x30) = 0;
    }
  }
  else {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x30) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x30));
      }
      *(undefined8 *)(lVar12 + 0x30) = 0;
    }
    *(uint *)(lVar12 + 0x28) = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pvVar8 = operator_new__(uVar11);
    *(void **)(lVar12 + 0x30) = pvVar8;
    if (*(int *)(lVar14 + 0x28) != 0) goto LAB_00f83f38;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        *(ulong *)((long)pvVar8 + uVar11 * 8) = *(ulong *)(lVar14 + 0x38) ^ 0x8000000000000000;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  *(double *)(lVar12 + 0x20) = dVar15 - *(double *)(lVar14 + 0x20);
  lVar14 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar14 < 3) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dVar15 = coord->fElem[lVar14 + 2];
  lVar14 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  lVar12 = CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar14 + 0x48);
  uVar13 = (ulong)uVar1;
  uVar2 = *(uint *)(lVar12 + 0x48);
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pvVar8 = *(void **)(lVar12 + 0x50);
LAB_00f8408a:
      if (0 < (int)uVar1) {
        lVar4 = *(long *)(lVar14 + 0x50);
        uVar11 = 0;
        do {
          *(ulong *)((long)pvVar8 + uVar11 * 8) =
               *(ulong *)(lVar4 + uVar11 * 8) ^ 0x8000000000000000;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x50) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x50));
      }
      *(undefined4 *)(lVar12 + 0x48) = 0;
      *(undefined8 *)(lVar12 + 0x50) = 0;
    }
  }
  else {
    if (uVar2 != 0) {
      if (*(void **)(lVar12 + 0x50) != (void *)0x0) {
        operator_delete__(*(void **)(lVar12 + 0x50));
      }
      *(undefined8 *)(lVar12 + 0x50) = 0;
    }
    *(uint *)(lVar12 + 0x48) = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pvVar8 = operator_new__(uVar11);
    *(void **)(lVar12 + 0x50) = pvVar8;
    if (*(int *)(lVar14 + 0x48) != 0) goto LAB_00f8408a;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        *(ulong *)((long)pvVar8 + uVar11 * 8) = *(ulong *)(lVar14 + 0x58) ^ 0x8000000000000000;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  *(double *)(lVar12 + 0x40) = dVar15 - *(double *)(lVar14 + 0x40);
  X<Fad<double>>(this,coord,par,&local_870.super_TPZVec<Fad<double>_>);
  pFVar6 = local_450.super_TPZVec<Fad<double>_>.fStore;
  dVar15 = *(this->fCenter3D).super_TPZVec<double>.fStore;
  pdVar10 = (double *)
            CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                     local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(pdVar10 + 1);
  uVar13 = (ulong)uVar1;
  uVar2 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pdVar9 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).ptr_to_data;
LAB_00f841c2:
      if (0 < (int)uVar1) {
        dVar16 = pdVar10[2];
        uVar11 = 0;
        do {
          pdVar9[uVar11] = -*(double *)((long)dVar16 + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      pdVar9 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).ptr_to_data;
      if (pdVar9 != (double *)0x0) {
        operator_delete__(pdVar9);
      }
      (pFVar6->dx_).num_elts = 0;
      (pFVar6->dx_).ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar2 != 0) {
      pdVar9 = ((local_450.super_TPZVec<Fad<double>_>.fStore)->dx_).ptr_to_data;
      if (pdVar9 != (double *)0x0) {
        operator_delete__(pdVar9);
      }
      (pFVar6->dx_).ptr_to_data = (double *)0x0;
    }
    (pFVar6->dx_).num_elts = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pdVar9 = (double *)operator_new__(uVar11);
    (pFVar6->dx_).ptr_to_data = pdVar9;
    if (*(int *)(pdVar10 + 1) != 0) goto LAB_00f841c2;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        pdVar9[uVar11] = -pdVar10[3];
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  pFVar7 = local_450.super_TPZVec<Fad<double>_>.fStore;
  pFVar6->val_ = dVar15 - *pdVar10;
  dVar15 = (this->fCenter3D).super_TPZVec<double>.fStore[1];
  lVar14 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar14 + 0x28);
  uVar13 = (ulong)uVar1;
  uVar2 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 != 0) {
      pdVar10 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.ptr_to_data;
LAB_00f842e4:
      if (0 < (int)uVar1) {
        lVar12 = *(long *)(lVar14 + 0x30);
        uVar11 = 0;
        do {
          pdVar10[uVar11] = -*(double *)(lVar12 + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
    }
  }
  else if (uVar1 == 0) {
    if (uVar2 != 0) {
      pdVar10 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.ptr_to_data;
      if (pdVar10 != (double *)0x0) {
        operator_delete__(pdVar10);
      }
      pFVar7[1].dx_.num_elts = 0;
      pFVar7[1].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar2 != 0) {
      pdVar10 = local_450.super_TPZVec<Fad<double>_>.fStore[1].dx_.ptr_to_data;
      if (pdVar10 != (double *)0x0) {
        operator_delete__(pdVar10);
      }
      pFVar7[1].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar7[1].dx_.num_elts = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pdVar10 = (double *)operator_new__(uVar11);
    pFVar7[1].dx_.ptr_to_data = pdVar10;
    if (*(int *)(lVar14 + 0x28) != 0) goto LAB_00f842e4;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        pdVar10[uVar11] = -*(double *)(lVar14 + 0x38);
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  pFVar6 = local_450.super_TPZVec<Fad<double>_>.fStore;
  pFVar7[1].val_ = dVar15 - *(double *)(lVar14 + 0x20);
  dVar15 = (this->fCenter3D).super_TPZVec<double>.fStore[2];
  lVar14 = CONCAT44(local_870.super_TPZVec<Fad<double>_>.fStore._4_4_,
                    local_870.super_TPZVec<Fad<double>_>.fStore._0_4_);
  uVar1 = *(uint *)(lVar14 + 0x48);
  uVar13 = (ulong)uVar1;
  uVar2 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00f8448c;
    pdVar10 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar10 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        pFVar6[2].dx_.num_elts = 0;
        pFVar6[2].dx_.ptr_to_data = (double *)0x0;
      }
      goto LAB_00f8448c;
    }
    if (uVar2 != 0) {
      pdVar10 = local_450.super_TPZVec<Fad<double>_>.fStore[2].dx_.ptr_to_data;
      if (pdVar10 != (double *)0x0) {
        operator_delete__(pdVar10);
      }
      pFVar6[2].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar6[2].dx_.num_elts = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = uVar13 * 8;
    }
    pdVar10 = (double *)operator_new__(uVar11);
    pFVar6[2].dx_.ptr_to_data = pdVar10;
    if (*(int *)(lVar14 + 0x48) == 0) {
      if (0 < (int)uVar1) {
        uVar11 = 0;
        do {
          pdVar10[uVar11] = -*(double *)(lVar14 + 0x58);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      goto LAB_00f8448c;
    }
  }
  if (0 < (int)uVar1) {
    lVar12 = *(long *)(lVar14 + 0x50);
    uVar11 = 0;
    do {
      pdVar10[uVar11] = -*(double *)(lVar12 + uVar11 * 8);
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
LAB_00f8448c:
  pFVar6[2].val_ = dVar15 - *(double *)(lVar14 + 0x40);
  local_960 = (Fad<double> *)
              CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_908 = local_960 + 1;
  local_970.fadexpr_.right_ =
       (Fad<double> *)
       CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_990._0_8_ = &local_908;
  local_990._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore + 1;
  local_958 = local_970.fadexpr_.right_ + 1;
  local_8c8 = &local_960;
  local_928._8_8_ = &local_8c8;
  local_8e8._0_8_ = local_928;
  local_970.fadexpr_.left_ = local_960 + 2;
  local_888.fadexpr_.left_ = &local_970;
  local_898._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore + 2;
  local_950._0_8_ = local_8e8;
  local_8a0 = local_970.fadexpr_.right_ + 2;
  local_950._8_8_ = (Fad<double> *)local_898;
  local_928._0_8_ = (Fad<double> *)local_990;
  local_900.left_.constant_ = (double)local_970.fadexpr_.right_;
  local_8e8._8_8_ = &local_888;
  local_8c0 = (Fad<double> *)local_990._8_8_;
  local_8a8 = local_960;
  local_898._0_8_ = &local_8a8;
  local_888.fadexpr_.right_ = (Fad<double> *)local_898._8_8_;
  Fad<double>::operator=
            (gradx->fElem,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)local_950);
  local_960 = (Fad<double> *)
              CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_8a8 = local_960 + 1;
  local_900.left_.constant_ =
       (double)CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_970.fadexpr_.left_ = local_960 + 2;
  local_970.fadexpr_.right_ = (Fad<double> *)((long)local_900.left_.constant_ + 0x20);
  local_990._0_8_ = &local_908;
  local_990._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore;
  local_8c8 = &local_960;
  local_8c0 = local_450.super_TPZVec<Fad<double>_>.fStore;
  local_928._8_8_ = &local_8c8;
  local_898._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore + 2;
  local_888.fadexpr_.left_ = &local_970;
  local_8e8._0_8_ = local_928;
  local_8a0 = (Fad<double> *)((long)local_900.left_.constant_ + 0x40);
  local_950._0_8_ = local_8e8;
  local_958 = local_970.fadexpr_.right_;
  local_950._8_8_ = (Fad<double> *)local_898;
  local_928._0_8_ = (Fad<double> *)local_990;
  local_908 = (Fad<double> *)local_878;
  local_8e8._8_8_ = &local_888;
  local_898._0_8_ = &local_8a8;
  local_888.fadexpr_.right_ = (Fad<double> *)local_898._8_8_;
  local_878 = (undefined1  [8])local_8a8;
  Fad<double>::operator=
            (gradx->fElem + 1,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)local_950);
  local_960 = (Fad<double> *)
              CONCAT44(local_5b0.super_TPZVec<Fad<double>_>.fStore._4_4_,
                       local_5b0.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_970.fadexpr_.left_ = local_960 + 2;
  local_900.left_.constant_ =
       (double)CONCAT44(local_710.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_710.super_TPZVec<Fad<double>_>.fStore._0_4_);
  local_990._0_8_ = &local_908;
  local_990._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore;
  local_958 = (Fad<double> *)((long)local_900.left_.constant_ + 0x40);
  local_8c8 = &local_960;
  local_8c0 = local_450.super_TPZVec<Fad<double>_>.fStore;
  local_970.fadexpr_.right_ = (Fad<double> *)((long)local_900.left_.constant_ + 0x20);
  local_898._8_8_ = local_450.super_TPZVec<Fad<double>_>.fStore + 1;
  local_888.fadexpr_.left_ = &local_970;
  local_8e8._0_8_ = local_928;
  local_8a8 = local_960 + 1;
  local_950._0_8_ = local_8e8;
  local_950._8_8_ = (Fad<double> *)local_898;
  local_928._0_8_ = (Fad<double> *)local_990;
  local_928._8_8_ =
       (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)&local_8c8;
  local_908 = (Fad<double> *)local_878;
  local_8e8._8_8_ = &local_888;
  local_8a0 = local_958;
  local_898._0_8_ = &local_8a8;
  local_888.fadexpr_.right_ = (Fad<double> *)local_898._8_8_;
  local_878 = (undefined1  [8])local_970.fadexpr_.left_;
  Fad<double>::operator=
            (gradx->fElem + 2,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)local_950);
  local_928._0_8_ =
       (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *)
       0x0;
  local_928._8_8_ = local_928._8_8_ & 0xffffffff00000000;
  local_918 = (double *)0x0;
  dStack_910 = 0.0;
  lVar14 = 0;
  do {
    lVar12 = CONCAT44(local_190.super_TPZVec<Fad<double>_>.fStore._4_4_,
                      local_190.super_TPZVec<Fad<double>_>.fStore._0_4_);
    if ((ABS(*(double *)(lVar12 + lVar14)) < 1e-12) &&
       (*(undefined8 *)(lVar12 + lVar14) = 0, *(int *)(lVar12 + 8 + lVar14) != 0)) {
      local_950._0_8_ = (Fad<double> *)0x0;
      Vector<double>::operator=((Vector<double> *)(lVar12 + lVar14 + 8),(double *)local_950);
    }
    local_950._0_8_ = (long)&gradx->fElem->val_ + lVar14;
    local_950._8_8_ = local_950._0_8_;
    Fad<double>::operator+=
              ((Fad<double> *)local_928,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_950);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x60);
  if (0.0 <= (double)local_928._0_8_) {
    dVar15 = this->fAngle * this->fRadius;
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_8e8,(Fad<double> *)local_928);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_950,
               (FadFuncSqrt<Fad<double>_> *)local_8e8);
    Fad<double>::~Fad((Fad<double> *)local_8e8);
    local_8c0 = (Fad<double> *)0x4000000000000000;
    dStack_8b8 = 0.0;
    local_900.left_.defaultVal = 0.0;
    local_900.left_.constant_ = dVar15;
    local_900.right_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)&local_8c8;
    local_8b0 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_950;
    if ((double)local_950._8_8_ < 0.0) {
      dVar16 = sqrt((double)local_950._8_8_);
    }
    else {
      dVar16 = SQRT((double)local_950._8_8_);
    }
    uVar5 = local_990._8_8_;
    local_990._0_8_ = dVar15 / (dVar16 + dVar16);
    iVar3 = (local_8b0->fadexpr_).expr_.dx_.num_elts;
    lVar14 = (long)iVar3;
    local_990._8_8_ = local_990._8_8_ & 0xffffffff00000000;
    local_980 = (double *)0x0;
    if (lVar14 < 1) {
      local_978 = 0.0;
    }
    else {
      local_990._12_4_ = SUB84(uVar5,4);
      local_990._8_4_ = iVar3;
      pdVar10 = (double *)operator_new__(lVar14 * 8);
      local_978 = 0.0;
      lVar12 = 0;
      local_980 = pdVar10;
      do {
        vVar17 = FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>
                 ::dx(&local_900,(int)lVar12);
        pdVar10[lVar12] = vVar17;
        lVar12 = lVar12 + 1;
      } while (lVar14 != lVar12);
    }
    Fad<double>::~Fad((Fad<double> *)(local_950 + 8));
    lVar14 = 0;
    do {
      local_950._0_8_ = (long)&gradx->fElem->val_ + lVar14;
      local_950._8_8_ = (Fad<double> *)local_990;
      Fad<double>::operator=
                ((Fad<double> *)local_950._0_8_,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_950);
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x60);
    Fad<double>::~Fad((Fad<double> *)local_990);
    Fad<double>::~Fad((Fad<double> *)local_928);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_2f0);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_870);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_190);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_710);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_5b0);
    TPZManVector<Fad<double>,_10>::~TPZManVector(&local_450);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzarc3d.h"
             ,0xd2);
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            
            /** Computing Axes */
            TPZManVector< T > Vpc(3,0.), Vpa(3,0.), Vpb(3,0.), Vt(3,0.), OUTv(3,0.);
            
            TPZManVector< T > middle(1, 0.);
            X(coord,middle,OUTv);
            
            /** Vector From MappedPoint to Ini */
            Vpa[0] = coord(0,0) - OUTv[0]; Vpa[1] = coord(1,0) - OUTv[1]; Vpa[2] = coord(2,0) - OUTv[2];
            
            /** Vector From MappedPoint to Fin */
            Vpb[0] = coord(0,1) - OUTv[0]; Vpb[1] = coord(1,1) - OUTv[1]; Vpb[2] = coord(2,1) - OUTv[2];
            
            X(coord,par,OUTv);
            
            /** Vector From MappedPoint to Center */
            Vpc[0] = fCenter3D[0] - OUTv[0]; Vpc[1] = fCenter3D[1] - OUTv[1]; Vpc[2] = fCenter3D[2] - OUTv[2];
            
            /** Tangent Vector From Point in the Arc */
            gradx(0) =  Vpa[1]*Vpb[0]*Vpc[1] - Vpa[0]*Vpb[1]*Vpc[1] + Vpa[2]*Vpb[0]*Vpc[2] - Vpa[0]*Vpb[2]*Vpc[2];
            gradx(1) = -Vpa[1]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[1]*Vpc[0] + Vpa[2]*Vpb[1]*Vpc[2] - Vpa[1]*Vpb[2]*Vpc[2];
            gradx(2) = -Vpa[2]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[2]*Vpc[0] - Vpa[2]*Vpb[1]*Vpc[1] + Vpa[1]*Vpb[2]*Vpc[1];
            
            T Vtnorm = 0.;
            for(int i = 0; i < 3; i++)
            {
                if( fabs(Vt[i]) < 1.E-12 ) Vt[i] = 0.;
                Vtnorm += gradx(i)*gradx(i);
            }
            if(Vtnorm < 0.) DebugStop();
//            if(sqrt(Vtnorm) < 1e-16) DebugStop();
            T scale = fAngle*fRadius/(2.*sqrt(Vtnorm));
            for(int j = 0; j < 3; j++) gradx(j) = gradx(j)*scale;

        }